

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_bench.cc
# Opt level: O2

int main(void)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  uint uVar5;
  result_type rVar6;
  ostream *poVar7;
  uint64_t i;
  long lVar8;
  allocator_type local_2821;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertex_ids;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> elements;
  uniform_int_distribution<unsigned_long> elem_id_dist;
  uniform_int_distribution<unsigned_long> vertex_id_dist;
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_27d0;
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_27b8;
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_27a0;
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2788;
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2770;
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2758;
  mt19937 gen;
  random_device rd;
  
  std::random_device::random_device(&rd);
  uVar5 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar5);
  vertex_id_dist._M_param._M_a = 0;
  vertex_id_dist._M_param._M_b = 0x800000000;
  elem_id_dist._M_param._M_a = 0;
  elem_id_dist._M_param._M_b = 4999999;
  std::operator<<((ostream *)&std::cout,"generating dataset .");
  std::ostream::flush();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vertex_ids,5000000,(allocator_type *)&elements);
  for (lVar8 = 0; lVar8 != 5000000; lVar8 = lVar8 + 1) {
    rVar6 = std::uniform_int_distribution<unsigned_long>::operator()(&vertex_id_dist,&gen);
    vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[lVar8] = rVar6;
  }
  std::operator<<((ostream *)&std::cout,".");
  std::ostream::flush();
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&elements,25000000,&local_2821);
  for (lVar8 = 0x18; lVar8 != 0x2faf0818; lVar8 = lVar8 + 0x20) {
    rVar6 = std::uniform_int_distribution<unsigned_long>::operator()(&elem_id_dist,&gen);
    uVar1 = vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[rVar6];
    rVar6 = std::uniform_int_distribution<unsigned_long>::operator()(&elem_id_dist,&gen);
    uVar2 = vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[rVar6];
    rVar6 = std::uniform_int_distribution<unsigned_long>::operator()(&elem_id_dist,&gen);
    uVar3 = vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[rVar6];
    rVar6 = std::uniform_int_distribution<unsigned_long>::operator()(&elem_id_dist,&gen);
    uVar4 = vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[rVar6];
    *(unsigned_long *)
     ((long)(elements.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8 + -0x18) = uVar1;
    *(unsigned_long *)
     ((long)(elements.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8 + -0x10) = uVar2;
    *(unsigned_long *)
     ((long)(elements.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8 + -8) = uVar3;
    *(unsigned_long *)
     ((long)(elements.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8) = uVar4;
  }
  poVar7 = std::operator<<((ostream *)&std::cout," done");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator<<((ostream *)&std::cout,"std::unordered_map, 1 thread: ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector((vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )&local_2758,&elements);
  renumber<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
            (&vertex_ids,
             (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
              *)&local_2758,1);
  std::
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~_Vector_base(&local_2758);
  std::operator<<((ostream *)&std::cout,
                  "std::unordered_map, 32 thread (single threaded insertion): ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector((vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )&local_2770,&elements);
  renumber<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
            (&vertex_ids,
             (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
              *)&local_2770,0x20);
  std::
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~_Vector_base(&local_2770);
  std::operator<<((ostream *)&std::cout,"pmap4, 1 thread: ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector((vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )&local_2788,&elements);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,phmap::NullMutex>>
            (&vertex_ids,
             (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
              *)&local_2788,1);
  std::
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~_Vector_base(&local_2788);
  std::operator<<((ostream *)&std::cout,"pmap4, 32 threads: ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector((vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )&local_27a0,&elements);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,phmap::NullMutex>>
            (&vertex_ids,
             (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
              *)&local_27a0,0x20);
  std::
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~_Vector_base(&local_27a0);
  std::operator<<((ostream *)&std::cout,"pmap6, 1 thread: ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector((vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )&local_27b8,&elements);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,phmap::NullMutex>>
            (&vertex_ids,
             (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
              *)&local_27b8,1);
  std::
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~_Vector_base(&local_27b8);
  std::operator<<((ostream *)&std::cout,"pmap6, 32 threads: ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector((vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )&local_27d0,&elements);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,phmap::NullMutex>>
            (&vertex_ids,
             (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
              *)&local_27d0,0x20);
  std::
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~_Vector_base(&local_27d0);
  std::
  _Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~_Vector_base(&elements.
                 super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
               );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::random_device::~random_device(&rd);
  return 0;
}

Assistant:

int main() {
    uint64_t nvertices = 5000000;
    uint64_t nelements = 25000000;

    std::random_device rd;  // a seed source for the random number engine
    std::mt19937 gen(rd()); // mersenne_twister_engine seeded with rd()
    std::uniform_int_distribution<uint64_t> vertex_id_dist(0, uint64_t(1) << 35);
    std::uniform_int_distribution<uint64_t> elem_id_dist(0, nvertices-1);

    std::cout << "generating dataset ." << std::flush;
    std::vector< uint64_t > vertex_ids(nvertices);
    for (uint64_t i = 0; i < nvertices; i++) {
        vertex_ids[i] = vertex_id_dist(gen);
    }

    std::cout << "." << std::flush;

    std::vector< std::array<uint64_t, 4> > elements(nelements);
    for (uint64_t i = 0; i < nelements; i++) {
        elements[i] = {
            vertex_ids[elem_id_dist(gen)], 
            vertex_ids[elem_id_dist(gen)], 
            vertex_ids[elem_id_dist(gen)], 
            vertex_ids[elem_id_dist(gen)]
        };
    }
    std::cout << " done" << std::endl;

    using stdmap = std::unordered_map<uint64_t, uint64_t>;
    std::cout << "std::unordered_map, 1 thread: ";
    renumber< stdmap, stdmap >(vertex_ids, elements, 1);

    std::cout << "std::unordered_map, 32 thread (single threaded insertion): ";
    renumber< stdmap, stdmap >(vertex_ids, elements, 32);

    std::cout << "pmap4, 1 thread: ";
    renumber< pmap<4>, pmap_nullmutex<4> >(vertex_ids, elements, 1);

    std::cout << "pmap4, 32 threads: ";
    renumber< pmap<4>, pmap_nullmutex<4> >(vertex_ids, elements, 32);

    std::cout << "pmap6, 1 thread: ";
    renumber< pmap<6>, pmap_nullmutex<6> >(vertex_ids, elements, 1);

    std::cout << "pmap6, 32 threads: ";
    renumber< pmap<6>, pmap_nullmutex<6> >(vertex_ids, elements, 32);
}